

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodes.c
# Opt level: O3

void cmp_D5(void)

{
  ubyte uVar1;
  
  except = '\0';
  uVar1 = getbyte(pc);
  temp1 = RAM[(byte)(uVar1 + x_reg)];
  _AL = acc;
  _AH = RAM[(byte)(uVar1 + x_reg)];
  carry_f = '\x01';
  result_f = '@';
  pc = pc + 1;
  return;
}

Assistant:

void cmp_D5(void) {
    uint flags;
    CLE;
    temp1 = RAM[(ubyte) (getbyte(pc) + x_reg)];

    asm("push ax");

    asm("CLC");
    if (!carry_f) asm("STC");

    _AL = acc;
    _AH = temp1;

    asm("cmp AL,AH");
    asm("pushf");
    asm("pop flags");
    asm("pop AX");

    carry_f = (flags & 1) ^ 1;
    result_f = flags & 0xC0;
    result_f ^= 0x40;

    pc++;
}